

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmyblas2.c
# Opt level: O3

void zmatvec(int ldm,int nrow,int ncol,doublecomplex *M,doublecomplex *vec,doublecomplex *Mxvec)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double dVar18;
  double dVar19;
  
  uVar13 = 0;
  if (3 < ncol) {
    lVar12 = (long)ldm;
    lVar14 = (long)(ldm * 4);
    pdVar16 = &M[lVar12].i;
    pdVar17 = &M[lVar12 * 2].i;
    pdVar15 = &M[lVar12 * 3].i;
    uVar13 = 0;
    do {
      if (0 < nrow) {
        dVar6 = vec[uVar13].r;
        dVar7 = vec[uVar13].i;
        dVar4 = vec[uVar13 + 1].r;
        dVar5 = vec[uVar13 + 1].i;
        dVar8 = vec[uVar13 + 2].r;
        dVar9 = vec[uVar13 + 2].i;
        dVar10 = vec[uVar13 + 3].r;
        dVar11 = vec[uVar13 + 3].i;
        lVar12 = 0;
        do {
          dVar2 = *(double *)((long)&M->r + lVar12);
          dVar3 = *(double *)((long)&M->i + lVar12);
          pdVar1 = (double *)((long)&Mxvec->r + lVar12);
          dVar18 = *pdVar1 + dVar2 * dVar6 + dVar3 * -dVar7;
          dVar19 = pdVar1[1] + dVar2 * dVar7 + dVar3 * dVar6;
          pdVar1 = (double *)((long)&Mxvec->r + lVar12);
          *pdVar1 = dVar18;
          pdVar1[1] = dVar19;
          dVar2 = *(double *)((long)pdVar16 + lVar12 + -8);
          dVar18 = dVar2 * dVar4 + *(double *)((long)pdVar16 + lVar12) * -dVar5 + dVar18;
          dVar19 = dVar2 * dVar5 + *(double *)((long)pdVar16 + lVar12) * dVar4 + dVar19;
          pdVar1 = (double *)((long)&Mxvec->r + lVar12);
          *pdVar1 = dVar18;
          pdVar1[1] = dVar19;
          dVar2 = *(double *)((long)pdVar17 + lVar12 + -8);
          dVar18 = dVar2 * dVar8 + *(double *)((long)pdVar17 + lVar12) * -dVar9 + dVar18;
          dVar19 = dVar2 * dVar9 + *(double *)((long)pdVar17 + lVar12) * dVar8 + dVar19;
          pdVar1 = (double *)((long)&Mxvec->r + lVar12);
          *pdVar1 = dVar18;
          pdVar1[1] = dVar19;
          dVar2 = *(double *)((long)pdVar15 + lVar12 + -8);
          dVar3 = *(double *)((long)pdVar15 + lVar12);
          pdVar1 = (double *)((long)&Mxvec->r + lVar12);
          *pdVar1 = dVar2 * dVar10 + dVar3 * -dVar11 + dVar18;
          pdVar1[1] = dVar2 * dVar11 + dVar3 * dVar10 + dVar19;
          lVar12 = lVar12 + 0x10;
        } while ((ulong)(uint)nrow << 4 != lVar12);
      }
      uVar13 = uVar13 + 4;
      M = M + lVar14;
      pdVar16 = pdVar16 + lVar14 * 2;
      pdVar17 = pdVar17 + lVar14 * 2;
      pdVar15 = pdVar15 + lVar14 * 2;
    } while (uVar13 < ncol - 3);
  }
  if ((int)uVar13 < ncol) {
    uVar13 = uVar13 & 0xffffffff;
    do {
      if (0 < nrow) {
        dVar6 = vec[uVar13].r;
        dVar7 = vec[uVar13].i;
        lVar12 = 0;
        do {
          dVar4 = *(double *)((long)&M->r + lVar12);
          dVar5 = *(double *)((long)&M->i + lVar12);
          pdVar15 = (double *)((long)&Mxvec->r + lVar12);
          dVar8 = pdVar15[1];
          pdVar16 = (double *)((long)&Mxvec->r + lVar12);
          *pdVar16 = *pdVar15 + dVar4 * dVar6 + dVar5 * -dVar7;
          pdVar16[1] = dVar8 + dVar4 * dVar7 + dVar5 * dVar6;
          lVar12 = lVar12 + 0x10;
        } while ((ulong)(uint)nrow << 4 != lVar12);
      }
      uVar13 = uVar13 + 1;
      M = M + ldm;
    } while (uVar13 != (uint)ncol);
  }
  return;
}

Assistant:

void zmatvec (int ldm, int nrow, int ncol, doublecomplex *M, doublecomplex *vec, doublecomplex *Mxvec)
{
    doublecomplex vi0, vi1, vi2, vi3;
    doublecomplex *M0, temp;
    doublecomplex *Mki0, *Mki1, *Mki2, *Mki3;
    register int firstcol = 0;
    int k;

    M0 = &M[0];

    while ( firstcol < ncol - 3 ) {	/* Do 4 columns */
	Mki0 = M0;
	Mki1 = Mki0 + ldm;
	Mki2 = Mki1 + ldm;
	Mki3 = Mki2 + ldm;

	vi0 = vec[firstcol++];
	vi1 = vec[firstcol++];
	vi2 = vec[firstcol++];
	vi3 = vec[firstcol++];	
	for (k = 0; k < nrow; k++) {
	    zz_mult(&temp, &vi0, Mki0); Mki0++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	    zz_mult(&temp, &vi1, Mki1); Mki1++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	    zz_mult(&temp, &vi2, Mki2); Mki2++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	    zz_mult(&temp, &vi3, Mki3); Mki3++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	}

	M0 += 4 * ldm;
    }

    while ( firstcol < ncol ) {		/* Do 1 column */
 	Mki0 = M0;
	vi0 = vec[firstcol++];
	for (k = 0; k < nrow; k++) {
	    zz_mult(&temp, &vi0, Mki0); Mki0++;
	    z_add(&Mxvec[k], &Mxvec[k], &temp);
	}
	M0 += ldm;
    }
	
}